

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_match_filename_finalise(parser_info *info)

{
  void *pvVar1;
  int iVar2;
  coda_expression *pcVar3;
  char *pcVar4;
  coda_expression *pcVar5;
  char length_str [25];
  
  pvVar1 = info->node->data;
  iVar2 = escaped_string_length(info->node->char_data);
  if (iVar2 < 0) {
    pcVar4 = "invalid escape sequence in string";
  }
  else {
    if (iVar2 != 0) {
      pcVar3 = coda_expression_new(expr_filename,(char *)0x0,(coda_expression *)0x0,
                                   (coda_expression *)0x0,(coda_expression *)0x0,
                                   (coda_expression *)0x0);
      if (pcVar3 == (coda_expression *)0x0) {
        return -1;
      }
      coda_str64((long)iVar2,length_str);
      pcVar4 = strdup(length_str);
      if (pcVar4 != (char *)0x0) {
        pcVar5 = coda_expression_new(expr_constant_integer,pcVar4,(coda_expression *)0x0,
                                     (coda_expression *)0x0,(coda_expression *)0x0,
                                     (coda_expression *)0x0);
        if (pcVar5 != (coda_expression *)0x0) {
          pcVar3 = coda_expression_new(expr_substr,(char *)0x0,
                                       *(coda_expression **)((long)pvVar1 + 8),pcVar5,pcVar3,
                                       (coda_expression *)0x0);
          *(undefined8 *)((long)pvVar1 + 8) = 0;
          if (pcVar3 == (coda_expression *)0x0) {
            return -1;
          }
          pcVar4 = strdup(info->node->char_data);
          if (pcVar4 == (char *)0x0) {
            coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                           ,0xa34);
          }
          else {
            pcVar5 = coda_expression_new(expr_constant_string,pcVar4,(coda_expression *)0x0,
                                         (coda_expression *)0x0,(coda_expression *)0x0,
                                         (coda_expression *)0x0);
            if (pcVar5 != (coda_expression *)0x0) {
              pcVar3 = coda_expression_new(expr_equal,(char *)0x0,pcVar3,pcVar5,
                                           (coda_expression *)0x0,(coda_expression *)0x0);
              *(coda_expression **)((long)pvVar1 + 8) = pcVar3;
              return -(uint)(pcVar3 == (coda_expression *)0x0);
            }
          }
        }
        coda_expression_delete(pcVar3);
        return -1;
      }
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0xa21);
      return -1;
    }
    pcVar4 = "empty string not allowed for filename match value";
  }
  coda_set_error(-400,pcVar4);
  return -1;
}

Assistant:

static int cd_match_filename_finalise(parser_info *info)
{
    coda_detection_rule_entry *entry;
    coda_expression *filename_expr;
    coda_expression *length_expr;
    coda_expression *lh_expr;
    coda_expression *rh_expr;
    char length_str[25];
    char *string_value;
    long value_length;

    entry = (coda_detection_rule_entry *)info->node->data;

    value_length = escaped_string_length(info->node->char_data);
    if (value_length < 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid escape sequence in string");
        return -1;
    }
    if (value_length == 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "empty string not allowed for filename match value");
        return -1;
    }

    filename_expr = coda_expression_new(expr_filename, NULL, NULL, NULL, NULL, NULL);
    if (filename_expr == NULL)
    {
        return -1;
    }
    coda_str64(value_length, length_str);
    string_value = strdup(length_str);
    if (string_value == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    length_expr = coda_expression_new(expr_constant_integer, string_value, NULL, NULL, NULL, NULL);
    if (length_expr == NULL)
    {
        coda_expression_delete(filename_expr);
        return -1;
    }
    lh_expr = coda_expression_new(expr_substr, NULL, entry->expression, length_expr, filename_expr, NULL);
    entry->expression = NULL;
    if (lh_expr == NULL)
    {
        return -1;
    }
    string_value = strdup(info->node->char_data);
    if (string_value == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        coda_expression_delete(lh_expr);
        return -1;
    }
    rh_expr = coda_expression_new(expr_constant_string, string_value, NULL, NULL, NULL, NULL);
    if (rh_expr == NULL)
    {
        coda_expression_delete(lh_expr);
        return -1;
    }
    entry->expression = coda_expression_new(expr_equal, NULL, lh_expr, rh_expr, NULL, NULL);
    if (entry->expression == NULL)
    {
        return -1;
    }

    return 0;
}